

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.h
# Opt level: O0

void __thiscall
Perseus::
PlanEndOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
          (Perseus *this,
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          *V)

{
  JointBeliefInterface *Q;
  BeliefInterface *in_RSI;
  long *in_RDI;
  double dVar1;
  double value;
  JointBeliefInterface *jb0;
  Perseus *in_stack_00000240;
  AlphaVectorPlanning *in_stack_ffffffffffffffc8;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffe0;
  
  PlanEndOfIteration(in_stack_00000240);
  AlphaVectorPlanning::GetPU(in_stack_ffffffffffffffc8);
  Q = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_ffffffffffffffe0);
  dVar1 = BeliefValue::GetValue(in_RSI,(QFunctionsDiscrete *)Q);
  if (Q != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*Q + 8))();
  }
  if ((double)in_RDI[3] < dVar1) {
    in_RDI[3] = (long)dVar1;
    (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI);
    if ((*(byte *)((long)in_RDI + 0x8b) & 1) == 0) {
      (**(code **)(*in_RDI + 0x38))(in_RDI,in_RDI + 9);
    }
  }
  return;
}

Assistant:

void PlanEndOfIteration(const VF &V)
        {
            PlanEndOfIteration();
            
            JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
            double value=BeliefValue::GetValue(*jb0, V);
            delete jb0;

            if(value>_m_bestValue)
            {
                _m_bestValue=value;
                StoreValueFunction(V);
                if(!_m_dryrun)
                    ExportValueFunction(_m_valueFunctionFilename);
            }
        }